

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cpp
# Opt level: O0

ostream * operator<<(ostream *os,ipv4_endpoint *endpoint)

{
  uint16_t uVar1;
  char *pcVar2;
  ostream *poVar3;
  in_addr_t local_1c;
  ipv4_endpoint *piStack_18;
  in_addr tmp;
  ipv4_endpoint *endpoint_local;
  ostream *os_local;
  
  piStack_18 = endpoint;
  memset(&local_1c,0,4);
  local_1c = piStack_18->addr_net;
  pcVar2 = inet_ntoa((in_addr)local_1c);
  poVar3 = std::operator<<(os,pcVar2);
  poVar3 = std::operator<<(poVar3,':');
  uVar1 = ipv4_endpoint::port(piStack_18);
  std::ostream::operator<<(poVar3,uVar1);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, ipv4_endpoint const& endpoint)
{
    in_addr tmp{};
    tmp.s_addr = endpoint.addr_net;
    os << inet_ntoa(tmp) << ':' << endpoint.port();
    return os;
}